

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O0

basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> * __thiscall
jessilib::string_cast<char32_t,std::basic_string_view<char32_t,std::char_traits<char32_t>>>
          (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
           *__return_storage_ptr__,jessilib *this,
          basic_string_view<char32_t,_std::char_traits<char32_t>_> *in_string)

{
  const_pointer __s;
  size_type __n;
  allocator<char32_t> local_19;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> *local_18;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> *in_string_local;
  
  local_18 = (basic_string_view<char32_t,_std::char_traits<char32_t>_> *)this;
  in_string_local =
       (basic_string_view<char32_t,_std::char_traits<char32_t>_> *)__return_storage_ptr__;
  __s = std::basic_string_view<char32_t,_std::char_traits<char32_t>_>::data
                  ((basic_string_view<char32_t,_std::char_traits<char32_t>_> *)this);
  __n = std::basic_string_view<char32_t,_std::char_traits<char32_t>_>::size(local_18);
  std::allocator<char32_t>::allocator(&local_19);
  std::__cxx11::u32string::u32string((u32string *)__return_storage_ptr__,__s,__n,&local_19);
  std::allocator<char32_t>::~allocator(&local_19);
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<OutCharT> string_cast(const InT& in_string) {
	static_assert(impl_unicode::is_string<InT>::value == true);
	using InCharT = std::remove_cvref_t<typename impl_unicode::is_string<InT>::type>;
	using InEquivalentT = typename unicode_traits<InCharT>::equivalent_type;
	using InViewT = std::basic_string_view<InCharT>;
	using OutT = std::basic_string<OutCharT>;

	if constexpr (std::is_same_v<InT, OutT>) {
		// This does nothing at all; consider static_assert against this?
		return in_string;
	}
	else if constexpr (std::is_same_v<OutCharT, InCharT>
	    || std::is_same_v<OutCharT, InEquivalentT>) {
		// Just do a dumb copy when same or equivalent char types; should be faster than re-encoding
		if constexpr (impl_unicode::is_string<InT>::is_container) {
			return { reinterpret_cast<const OutCharT*>(in_string.data()), in_string.size() };
		}
		else if constexpr (impl_unicode::is_string<InT>::is_fixed_array) {
			return { reinterpret_cast<const OutCharT*>(in_string), std::size(in_string) - 1 }; // strip null term
		}
		else {
			return { reinterpret_cast<const OutCharT*>(in_string) };
		}
	}
	else {
		// Last resort: reencode the string
		std::basic_string<OutCharT> result;
		InViewT in_string_view = static_cast<InViewT>(in_string);
		if constexpr (sizeof(InCharT) <= sizeof(OutCharT)) {
			// When copying to a larger type, we will need _at most_ as many elements as the smaller storage type
			result.reserve(in_string_view.size());
		}
		else {
			result.reserve(in_string_view.size() * (sizeof(OutCharT) / sizeof(InCharT)));
		}

		while (!in_string_view.empty()) {
			decode_result string_front = decode_codepoint(in_string_view);
			if (string_front.units == 0) {
				return {};
			}
			in_string_view.remove_prefix(string_front.units);

			encode_codepoint(result, string_front.codepoint);
		}

		return result;
	}
}